

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::TaskSet::Task::Task(Task *this,TaskSet *taskSet,Own<kj::_::PromiseNode> *nodeParam)

{
  PromiseNode *pPVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  _::Event::Event(&this->super_Event);
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_0042f260;
  this->prev = (Maybe<kj::Own<kj::TaskSet::Task>_> *)0x0;
  (this->next).ptr.disposer = (Disposer *)0x0;
  (this->next).ptr.ptr = (Task *)0x0;
  this->taskSet = taskSet;
  uVar2 = *(undefined4 *)((long)&nodeParam->disposer + 4);
  uVar3 = *(undefined4 *)&nodeParam->ptr;
  uVar4 = *(undefined4 *)((long)&nodeParam->ptr + 4);
  *(undefined4 *)&(this->node).disposer = *(undefined4 *)&nodeParam->disposer;
  *(undefined4 *)((long)&(this->node).disposer + 4) = uVar2;
  *(undefined4 *)&(this->node).ptr = uVar3;
  *(undefined4 *)((long)&(this->node).ptr + 4) = uVar4;
  nodeParam->ptr = (PromiseNode *)0x0;
  pPVar1 = (this->node).ptr;
  (*pPVar1->_vptr_PromiseNode[1])(pPVar1,&this->node);
  pPVar1 = (this->node).ptr;
  (**pPVar1->_vptr_PromiseNode)(pPVar1,this);
  return;
}

Assistant:

Task(TaskSet& taskSet, Own<_::PromiseNode>&& nodeParam)
      : taskSet(taskSet), node(kj::mv(nodeParam)) {
    node->setSelfPointer(&node);
    node->onReady(this);
  }